

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O0

bool __thiscall
ON_ReferencedComponentSettingsImpl::Internal_UpdateLayer
          (ON_ReferencedComponentSettingsImpl *this,ON_Layer *layer)

{
  ON_Layer *previous_referenced_file_layer;
  uchar reference_file_layer [8];
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_UUID *pOVar4;
  ON_Layer **ppOVar5;
  int local_38;
  int i;
  int count;
  ON_UUID reference_file_layer_id;
  ON_Layer *layer_local;
  ON_ReferencedComponentSettingsImpl *this_local;
  
  reference_file_layer_id.Data4 = (uchar  [8])layer;
  pOVar4 = ON_ModelComponent::Id(&layer->super_ON_ModelComponent);
  i = pOVar4->Data1;
  unique0x00012004 = pOVar4->Data2;
  unique0x00012006 = pOVar4->Data3;
  reference_file_layer_id._0_8_ = *(undefined8 *)pOVar4->Data4;
  bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)&i);
  if (((!bVar1) &&
      (iVar2 = ON_SimpleArray<ON_Layer_*>::Count(&this->m_layer_referenced_file_copy), 0 < iVar2))
     && (iVar3 = ON_SimpleArray<ON_Layer_*>::Count(&this->m_layer_model_copy), iVar2 == iVar3)) {
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      ppOVar5 = ON_SimpleArray<ON_Layer_*>::operator[](&this->m_layer_referenced_file_copy,local_38)
      ;
      if (*ppOVar5 != (ON_Layer *)0x0) {
        ppOVar5 = ON_SimpleArray<ON_Layer_*>::operator[]
                            (&this->m_layer_referenced_file_copy,local_38);
        pOVar4 = ON_ModelComponent::Id(&(*ppOVar5)->super_ON_ModelComponent);
        bVar1 = ::operator!=((ON_UUID_struct *)&i,pOVar4);
        if ((!bVar1) &&
           (ppOVar5 = ON_SimpleArray<ON_Layer_*>::operator[](&this->m_layer_model_copy,local_38),
           *ppOVar5 != (ON_Layer *)0x0)) {
          ppOVar5 = ON_SimpleArray<ON_Layer_*>::operator[]
                              (&this->m_layer_referenced_file_copy,local_38);
          reference_file_layer = reference_file_layer_id.Data4;
          previous_referenced_file_layer = *ppOVar5;
          ppOVar5 = ON_SimpleArray<ON_Layer_*>::operator[](&this->m_layer_model_copy,local_38);
          bVar1 = Internal_UpdateLayer
                            (previous_referenced_file_layer,(ON_Layer *)reference_file_layer,
                             *ppOVar5,(ON_Layer *)reference_file_layer_id.Data4);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_ReferencedComponentSettingsImpl::Internal_UpdateLayer(
  ON_Layer& layer
  ) const
{
  for (;;)
  {
    // input layer has values read from reference file,
    // so layer->Id() = reference file layer id
    const ON_UUID reference_file_layer_id = layer.Id();
    if (ON_nil_uuid == reference_file_layer_id)
      break;

    const int count = m_layer_referenced_file_copy.Count();
    if (count <= 0)
      break;
    if (count != m_layer_model_copy.Count())
      break;
    for (int i = 0; i < count; i++)
    {
      if (nullptr == m_layer_referenced_file_copy[i])
        continue;
      if (reference_file_layer_id != m_layer_referenced_file_copy[i]->Id())
        continue;
      if (nullptr == m_layer_model_copy[i])
        continue;
      return ON_ReferencedComponentSettingsImpl::Internal_UpdateLayer(
        *m_layer_referenced_file_copy[i],
        layer,
        *m_layer_model_copy[i],
        layer
        );
    }
    break;
  }

  return false;
}